

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

int __thiscall pbrt::Disk::writeTo(Disk *this,BinaryWriter *binary)

{
  BinaryWriter *in_RSI;
  affine3f *in_RDI;
  BinaryWriter *in_stack_00000048;
  Shape *in_stack_00000050;
  
  Shape::writeTo(in_stack_00000050,in_stack_00000048);
  BinaryWriter::write<float>(in_RSI,(float *)in_RDI);
  BinaryWriter::write<float>(in_RSI,(float *)in_RDI);
  BinaryWriter::write<pbrt::math::affine3f>(in_RSI,in_RDI);
  return 0x35;
}

Assistant:

int Disk::writeTo(BinaryWriter &binary) 
  {
    Shape::writeTo(binary);
    binary.write(radius);
    binary.write(height);
    binary.write(transform);
    return TYPE_DISK;
  }